

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcrashhandler.cpp
# Opt level: O3

iovec QTest::CrashHandler::asyncSafeToString(int n,AsyncSafeIntBuffer *result)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  __integer_to_chars_result_type<int> _Var7;
  iovec iVar8;
  ulong uVar6;
  
  uVar3 = (ulong)(uint)n;
  _Var7 = std::__to_chars_i<int>((char *)result,(char *)(result + 1),n,10);
  pcVar2 = _Var7.ptr;
  if (_Var7.ec != 0) {
    pcVar2 = (char *)result;
    if (n < 0) {
      (result->array)._M_elems[0] = '-';
      uVar3 = (ulong)(uint)-n;
      pcVar2 = (result->array)._M_elems + 1;
    }
    uVar5 = 1000000000;
    if (999999999 < (uint)uVar3) goto LAB_001372f4;
    uVar6 = 1000000000;
    do {
      uVar4 = (uint)uVar6;
      uVar5 = uVar6 / 10;
      if (uVar4 < 10) break;
      uVar1 = uVar6 / 10;
      uVar6 = uVar5;
    } while ((int)(uint)uVar3 < (int)uVar1);
    while (0x13 < uVar4) {
LAB_001372f4:
      uVar6 = uVar3 / uVar5;
      uVar3 = uVar3 % uVar5;
      *pcVar2 = (char)uVar6 + '0';
      pcVar2 = pcVar2 + 1;
      uVar4 = (uint)uVar5;
      uVar5 = uVar5 / 10;
    }
    *pcVar2 = (char)uVar3 + '0';
    pcVar2 = pcVar2 + 1;
  }
  iVar8.iov_len = (long)pcVar2 - (long)result;
  iVar8.iov_base = result;
  return iVar8;
}

Assistant:

struct iovec asyncSafeToString(int n, AsyncSafeIntBuffer &&result)
{
    char *ptr = result.array.data();
    if (false) {
#ifdef __cpp_lib_to_chars
    } else if (auto r = std::to_chars(ptr, ptr + result.array.size(), n, 10); r.ec == std::errc{}) {
        ptr = r.ptr;
#endif
    } else {
        // handle the sign
        if (n < 0) {
            *ptr++ = '-';
            n = -n;
        }

        // find the highest power of the base that is less than this number
        static constexpr int StartingDivider = ([]() {
            int divider = 1;
            for (int i = 0; i < std::numeric_limits<int>::digits10; ++i)
                divider *= 10;
            return divider;
        }());
        int divider = StartingDivider;
        while (divider && n < divider)
            divider /= 10;

        // now convert to string
        while (divider > 1) {
            int quot = n / divider;
            n = n % divider;
            divider /= 10;
            *ptr++ = quot + '0';
        }
        *ptr++ = n + '0';
    }

#ifndef QT_NO_DEBUG
    // this isn't necessary, it just helps in the debugger
    *ptr = '\0';
#endif
    struct iovec r;
    r.iov_base = result.array.data();
    r.iov_len = ptr - result.array.data();
    return r;
}